

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

CoverageOptionSyntax * __thiscall
slang::parsing::Parser::parseCoverageOption(Parser *this,AttrList attributes)

{
  SyntaxNode *this_00;
  NameSyntax *pNVar1;
  int iVar2;
  SyntaxNode *this_01;
  BinaryExpressionSyntax *pBVar3;
  ScopedNameSyntax *pSVar4;
  CoverageOptionSyntax *pCVar5;
  char *func;
  string_view sVar6;
  SourceRange range;
  Token semi;
  Token token;
  Token local_70;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  local_70 = ParserBase::peek(&this->super_ParserBase);
  if (local_70.kind != Identifier) {
    return (CoverageOptionSyntax *)0x0;
  }
  sVar6 = Token::valueText(&local_70);
  if ((sVar6._M_len != 6) || (iVar2 = bcmp(sVar6._M_str,"option",6), iVar2 != 0)) {
    sVar6 = Token::valueText(&local_70);
    if (sVar6._M_len != 0xb) {
      return (CoverageOptionSyntax *)0x0;
    }
    iVar2 = bcmp(sVar6._M_str,"type_option",0xb);
    if (iVar2 != 0) {
      return (CoverageOptionSyntax *)0x0;
    }
  }
  this_01 = &parseExpression(this)->super_SyntaxNode;
  if (this_01->kind == AssignmentExpression) {
    pBVar3 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>(this_01);
    this_00 = &((pBVar3->left).ptr)->super_SyntaxNode;
    if (this_00 == (SyntaxNode *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_0032ec6a;
    }
    if (this_00->kind == ScopedName) {
      pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(this_00);
      pNVar1 = (pSVar4->left).ptr;
      if (pNVar1 == (NameSyntax *)0x0) {
LAB_0032ec55:
        func = 
        "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]"
        ;
LAB_0032ec6a:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,func);
      }
      if ((pNVar1->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) {
        pNVar1 = (pSVar4->right).ptr;
        if (pNVar1 == (NameSyntax *)0x0) goto LAB_0032ec55;
        if ((pNVar1->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName)
        goto LAB_0032ebe6;
      }
    }
  }
  range = slang::syntax::SyntaxNode::sourceRange(this_01);
  ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x540005,range);
LAB_0032ebe6:
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ea348;
  local_60.super_SyntaxListBase.childCount = attributes.size_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       attributes.data_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       attributes.size_;
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pCVar5 = slang::syntax::SyntaxFactory::coverageOption
                     (&this->factory,&local_60,(ExpressionSyntax *)this_01,semi);
  return pCVar5;
}

Assistant:

CoverageOptionSyntax* Parser::parseCoverageOption(AttrList attributes) {
    auto token = peek();
    if (token.kind == TokenKind::Identifier) {
        if (token.valueText() == "option" || token.valueText() == "type_option") {
            auto& expr = parseExpression();
            if (!isValidOption(expr))
                addDiag(diag::InvalidCoverageOption, expr.sourceRange());

            return &factory.coverageOption(attributes, expr, expect(TokenKind::Semicolon));
        }
    }
    return nullptr;
}